

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_require_extension(spvc_compiler compiler,char *line)

{
  spvc_context_s *this;
  char *pcVar1;
  CompilerGLSL *this_00;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *line_local;
  spvc_compiler compiler_local;
  
  local_20 = line;
  line_local = (char *)compiler;
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    this_00 = (CompilerGLSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
    spirv_cross::CompilerGLSL::require_extension(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_require_extension(spvc_compiler compiler, const char *line)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->require_extension(line);
	return SPVC_SUCCESS;
#else
	(void)line;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}